

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericArray>
          (GenericDatum *this,NodePtr *schema,GenericArray *v)

{
  Type TVar1;
  type this_00;
  GenericArray *this_01;
  GenericArray *in_RDX;
  shared_ptr<avro::Node> *in_RSI;
  GenericDatum *in_RDI;
  
  this_00 = boost::shared_ptr<avro::Node>::operator->(in_RSI);
  TVar1 = Node::type(this_00);
  in_RDI->type_ = TVar1;
  boost::any::any(&in_RDI->value_);
  init(in_RDI,(EVP_PKEY_CTX *)in_RSI);
  this_01 = value<avro::GenericArray>((GenericDatum *)0x1b55c8);
  GenericArray::operator=(this_01,in_RDX);
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }